

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamhdr.c
# Opt level: O0

void nn_streamhdr_start(nn_streamhdr *self,nn_usock *usock,nn_pipebase *pipebase)

{
  bool bVar1;
  uint16_t local_2c [2];
  size_t sStack_28;
  int protocol;
  size_t sz;
  nn_pipebase *pipebase_local;
  nn_usock *usock_local;
  nn_streamhdr *self_local;
  
  bVar1 = false;
  if (self->usock == (nn_usock *)0x0) {
    bVar1 = (self->usock_owner).fsm == (nn_fsm *)0x0;
  }
  sz = (size_t)pipebase;
  pipebase_local = (nn_pipebase *)usock;
  usock_local = (nn_usock *)self;
  if (!bVar1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
            "self->usock == NULL && self->usock_owner.fsm == NULL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/utils/streamhdr.c"
            ,0x59);
    fflush(_stderr);
    nn_err_abort();
  }
  (self->usock_owner).src = 1;
  (self->usock_owner).fsm = &self->fsm;
  nn_usock_swap_owner(usock,&self->usock_owner);
  *(nn_pipebase **)&usock_local->task_connected = pipebase_local;
  *(size_t *)&usock_local->task_accept = sz;
  sStack_28 = 4;
  nn_pipebase_getopt((nn_pipebase *)sz,0,0xd,local_2c,&stack0xffffffffffffffd8);
  if (sStack_28 != 4) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (protocol)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/utils/streamhdr.c"
            ,99);
    fflush(_stderr);
    nn_err_abort();
  }
  (usock_local->task_accept).owner = (nn_fsm *)0x505300;
  nn_puts((uint8_t *)((long)&(usock_local->task_accept).owner + 4),local_2c[0]);
  nn_fsm_start(&usock_local->fsm);
  return;
}

Assistant:

void nn_streamhdr_start (struct nn_streamhdr *self, struct nn_usock *usock,
    struct nn_pipebase *pipebase)
{
    size_t sz;
    int protocol;

    /*  Take ownership of the underlying socket. */
    nn_assert (self->usock == NULL && self->usock_owner.fsm == NULL);
    self->usock_owner.src = NN_STREAMHDR_SRC_USOCK;
    self->usock_owner.fsm = &self->fsm;
    nn_usock_swap_owner (usock, &self->usock_owner);
    self->usock = usock;
    self->pipebase = pipebase;

    /*  Get the protocol identifier. */
    sz = sizeof (protocol);
    nn_pipebase_getopt (pipebase, NN_SOL_SOCKET, NN_PROTOCOL, &protocol, &sz);
    nn_assert (sz == sizeof (protocol));

    /*  Compose the protocol header. */
    memcpy (self->protohdr, "\0SP\0\0\0\0\0", 8);
    nn_puts (self->protohdr + 4, (uint16_t) protocol);

    /*  Launch the state machine. */
    nn_fsm_start (&self->fsm);
}